

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall ft::deque<int,_ft::allocator<int>_>::clear(deque<int,_ft::allocator<int>_> *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  iterator local_68;
  iterator local_40;
  ulong local_18;
  size_type n;
  deque<int,_ft::allocator<int>_> *this_local;
  
  n = (size_type)this;
  for (local_18 = size(this); uVar1 = local_18, sVar3 = size(this), sVar3 >> 1 < uVar1;
      local_18 = local_18 - 1) {
    pop_back(this);
  }
  while( true ) {
    begin(&local_40,this);
    end(&local_68,this);
    bVar2 = operator!=(&local_40,&local_68);
    dequeIterator<int,_64UL>::~dequeIterator(&local_68);
    dequeIterator<int,_64UL>::~dequeIterator(&local_40);
    if (!bVar2) break;
    pop_front(this);
  }
  return;
}

Assistant:

void clear() {
		size_type n = this->size();
		while (n > this->size() / 2) {
			this->pop_back();
			--n;
		}

		while (this->begin() != this->end())
			this->pop_front();
	}